

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_service_helpers(t_java_generator *this,t_service *tservice)

{
  pointer pptVar1;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  vector<t_function_*,_std::allocator<t_function_*>_> local_30;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_30,&tservice->functions_);
  if (local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar1 = local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      generate_java_struct_definition
                (this,(ostream *)&this->f_service_,(*pptVar1)->arglist_,false,true,false);
      generate_function_helpers(this,*pptVar1);
      pptVar1 = pptVar1 + 1;
    } while (pptVar1 !=
             local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_java_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_java_struct_definition(f_service_, ts, false, true);
    generate_function_helpers(*f_iter);
  }
}